

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pTextureFilteringTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Performance::TextureFilteringTests::init(TextureFilteringTests *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  deUint32 internalFormat;
  int iVar2;
  TestNode *this_00;
  float *pfVar3;
  long *plVar4;
  Texture2DRenderCase *this_01;
  int row_2;
  long lVar5;
  long *plVar6;
  int row;
  long lVar7;
  long lVar8;
  Mat3 *coordTransform;
  bool bVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined4 uVar14;
  allocator<char> local_139;
  Matrix<float,_3,_3> local_138;
  Matrix<float,_3,_3> res_1;
  long *local_d8;
  undefined4 local_d0;
  long local_c8 [2];
  char *local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  long local_a0;
  TestNode *local_98;
  ulong local_90;
  ulong local_88;
  char *local_80;
  Mat3 magTransform;
  Mat3 minTransform;
  long lVar13;
  
  pfVar3 = (float *)&magTransform;
  magTransform.m_data.m_data[1].m_data[1] = 0.0;
  magTransform.m_data.m_data[1].m_data[2] = 0.0;
  magTransform.m_data.m_data[0].m_data[0] = 0.0;
  magTransform.m_data.m_data[0].m_data[1] = 0.0;
  magTransform.m_data.m_data[0].m_data[2] = 0.0;
  magTransform.m_data.m_data[1].m_data[0] = 0.0;
  magTransform.m_data.m_data[2].m_data[2] = 0.0;
  lVar5 = 0;
  lVar7 = 0;
  do {
    lVar8 = 0;
    auVar11 = _DAT_019f34d0;
    do {
      bVar9 = SUB164(auVar11 ^ _DAT_019ec5b0,4) == -0x80000000 &&
              SUB164(auVar11 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
      if (bVar9) {
        uVar14 = 0x3f800000;
        if (lVar5 != lVar8) {
          uVar14 = 0;
        }
        *(undefined4 *)((long)pfVar3 + lVar8) = uVar14;
      }
      if (bVar9) {
        uVar14 = 0x3f800000;
        if (lVar5 + -0xc != lVar8) {
          uVar14 = 0;
        }
        *(undefined4 *)((long)pfVar3 + lVar8 + 0xc) = uVar14;
      }
      lVar13 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar13 + 2;
      lVar8 = lVar8 + 0x18;
    } while (lVar8 != 0x30);
    lVar7 = lVar7 + 1;
    lVar5 = lVar5 + 0xc;
    pfVar3 = pfVar3 + 1;
  } while (lVar7 != 3);
  magTransform.m_data.m_data[2].m_data[0] = -0.3;
  magTransform.m_data.m_data[2].m_data[1] = -0.6;
  local_138.m_data.m_data[0].m_data[0] = 1.7;
  local_138.m_data.m_data[0].m_data[1] = 2.3;
  local_138.m_data.m_data[0].m_data[2] = 1.0;
  pfVar3 = (float *)&res_1;
  res_1.m_data.m_data[0].m_data[0] = 0.0;
  res_1.m_data.m_data[0].m_data[1] = 0.0;
  res_1.m_data.m_data[0].m_data[2] = 0.0;
  res_1.m_data.m_data[1].m_data[0] = 0.0;
  res_1.m_data.m_data[1].m_data[1] = 0.0;
  res_1.m_data.m_data[1].m_data[2] = 0.0;
  res_1.m_data.m_data[2].m_data[0] = 0.0;
  res_1.m_data.m_data[2].m_data[1] = 0.0;
  res_1.m_data.m_data[2].m_data[2] = 0.0;
  lVar5 = 0;
  lVar7 = 0;
  do {
    lVar8 = 0;
    do {
      fVar10 = 0.0;
      if (lVar5 == lVar8) {
        fVar10 = local_138.m_data.m_data[0].m_data[lVar7];
      }
      *(float *)((long)pfVar3 + lVar8) = fVar10;
      lVar8 = lVar8 + 0xc;
    } while (lVar8 != 0x24);
    lVar7 = lVar7 + 1;
    pfVar3 = pfVar3 + 1;
    lVar5 = lVar5 + 0xc;
  } while (lVar7 != 3);
  pfVar3 = (float *)&res_1;
  local_b8 = (char *)0x8000000080000000;
  uStack_b0 = 0x80000000;
  uStack_ac = 0x80000000;
  tcu::operator*(&minTransform,&magTransform,(Matrix<float,_3,_3> *)pfVar3);
  iVar2 = (int)local_b8;
  res_1.m_data.m_data[1].m_data[1] = 0.0;
  res_1.m_data.m_data[1].m_data[2] = 0.0;
  res_1.m_data.m_data[0].m_data[0] = 0.0;
  res_1.m_data.m_data[0].m_data[1] = 0.0;
  res_1.m_data.m_data[0].m_data[2] = 0.0;
  res_1.m_data.m_data[1].m_data[0] = 0.0;
  res_1.m_data.m_data[2].m_data[2] = 0.0;
  lVar5 = 0;
  lVar7 = 0;
  do {
    lVar8 = 0;
    auVar12 = _DAT_019f34d0;
    do {
      bVar9 = SUB164(auVar12 ^ _DAT_019ec5b0,4) == iVar2 &&
              SUB164(auVar12 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
      if (bVar9) {
        uVar14 = 0x3f800000;
        if (lVar5 != lVar8) {
          uVar14 = 0;
        }
        *(undefined4 *)((long)pfVar3 + lVar8) = uVar14;
      }
      if (bVar9) {
        uVar14 = 0x3f800000;
        if (lVar5 + -0xc != lVar8) {
          uVar14 = 0;
        }
        *(undefined4 *)((long)pfVar3 + lVar8 + 0xc) = uVar14;
      }
      lVar13 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar13 + 2;
      lVar8 = lVar8 + 0x18;
    } while (lVar8 != 0x30);
    lVar7 = lVar7 + 1;
    lVar5 = lVar5 + 0xc;
    pfVar3 = pfVar3 + 1;
  } while (lVar7 != 3);
  res_1.m_data.m_data[2].m_data[0] = 0.3;
  res_1.m_data.m_data[2].m_data[1] = 0.4;
  local_d8 = (long *)0x3e4ccccd3e99999a;
  local_d0 = 0x3f800000;
  pfVar3 = (float *)&local_138;
  local_138.m_data.m_data[0].m_data._0_8_ = (float *)0x0;
  local_138.m_data.m_data[0].m_data[2] = 0.0;
  local_138.m_data.m_data[1].m_data[0] = 0.0;
  local_138.m_data.m_data[1].m_data[1] = 0.0;
  local_138.m_data.m_data[1].m_data[2] = 0.0;
  local_138.m_data.m_data[2].m_data[0] = 0.0;
  local_138.m_data.m_data[2].m_data[1] = 0.0;
  local_138.m_data.m_data[2].m_data[2] = 0.0;
  lVar5 = 0;
  lVar7 = 0;
  do {
    lVar8 = 0;
    do {
      uVar14 = 0;
      if (lVar5 == lVar8) {
        uVar14 = *(undefined4 *)((long)&local_d8 + lVar7 * 4);
      }
      *(undefined4 *)((long)pfVar3 + lVar8) = uVar14;
      lVar8 = lVar8 + 0xc;
    } while (lVar8 != 0x24);
    lVar7 = lVar7 + 1;
    pfVar3 = pfVar3 + 1;
    lVar5 = lVar5 + 0xc;
  } while (lVar7 != 3);
  local_98 = (TestNode *)this;
  tcu::operator*(&magTransform,&res_1,&local_138);
  this_00 = local_98;
  local_a0 = 0;
  do {
    uVar1 = init::cases[local_a0].filter;
    local_88 = (ulong)uVar1;
    local_90 = 0x2601;
    if ((uVar1 & 0xfffffffe) == 0x2600) {
      local_90 = (ulong)uVar1;
    }
    bVar9 = init::cases[local_a0].minify != false;
    local_b8 = init::cases[local_a0].name;
    local_80 = "_magnify_";
    if (bVar9) {
      local_80 = "_minify_";
    }
    coordTransform = &magTransform;
    if (bVar9) {
      coordTransform = &minTransform;
    }
    lVar5 = 0;
    do {
      internalFormat = *(deUint32 *)((long)&init::texFormats[0].internalFormat + lVar5);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,local_b8,&local_139);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
      local_138.m_data.m_data[0].m_data._0_8_ = local_138.m_data.m_data[1].m_data + 1;
      plVar6 = plVar4 + 2;
      if ((float *)*plVar4 == (float *)plVar6) {
        local_138.m_data.m_data[1].m_data._4_8_ = *plVar6;
        local_138.m_data.m_data[2].m_data._0_8_ = plVar4[3];
      }
      else {
        local_138.m_data.m_data[1].m_data._4_8_ = *plVar6;
        local_138.m_data.m_data[0].m_data._0_8_ = (float *)*plVar4;
      }
      local_138.m_data.m_data._8_8_ = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_138);
      res_1.m_data.m_data[0].m_data._0_8_ = res_1.m_data.m_data[1].m_data + 1;
      plVar6 = plVar4 + 2;
      if ((long *)*plVar4 == plVar6) {
        res_1.m_data.m_data[1].m_data._4_8_ = *plVar6;
        res_1.m_data.m_data[2].m_data._0_8_ = plVar4[3];
      }
      else {
        res_1.m_data.m_data[1].m_data._4_8_ = *plVar6;
        res_1.m_data.m_data[0].m_data._0_8_ = (long *)*plVar4;
      }
      res_1.m_data.m_data._8_8_ = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((float *)local_138.m_data.m_data[0].m_data._0_8_ != local_138.m_data.m_data[1].m_data + 1)
      {
        operator_delete((void *)local_138.m_data.m_data[0].m_data._0_8_,
                        local_138.m_data.m_data[1].m_data._4_8_ + 1);
      }
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
      this_01 = (Texture2DRenderCase *)operator_new(0x218);
      Texture2DRenderCase::Texture2DRenderCase
                (this_01,(Context *)this_00[1]._vptr_TestNode,
                 (char *)res_1.m_data.m_data[0].m_data._0_8_,
                 glcts::fixed_sample_locations_values + 1,internalFormat,0x2901,0x2901,
                 (deUint32)local_88,(deUint32)local_90,coordTransform,1,true);
      tcu::TestNode::addChild(this_00,(TestNode *)this_01);
      if ((float *)res_1.m_data.m_data[0].m_data._0_8_ != res_1.m_data.m_data[1].m_data + 1) {
        operator_delete((void *)res_1.m_data.m_data[0].m_data._0_8_,
                        res_1.m_data.m_data[1].m_data._4_8_ + 1);
      }
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x40);
    local_a0 = local_a0 + 1;
  } while (local_a0 != 8);
  return 8;
}

Assistant:

void TextureFilteringTests::init (void)
{
	static const struct
	{
		const char*	name;
		deUint32	internalFormat;
	} texFormats[] =
	{
		{ "rgb565",		GL_RGB565	},
		{ "rgba8",		GL_RGBA8	},
		{ "rg16f",		GL_RG16F	},
		{ "rgba16f",	GL_RGBA16F	}
	};
	static const struct
	{
		const char*	name;
		deUint32	filter;
		bool		minify;
	} cases[] =
	{
		{ "nearest",				GL_NEAREST,					true	},
		{ "nearest",				GL_NEAREST,					false	},
		{ "linear",					GL_LINEAR,					true	},
		{ "linear",					GL_LINEAR,					false	},
		{ "nearest_mipmap_nearest",	GL_NEAREST_MIPMAP_NEAREST,	true	},
		{ "nearest_mipmap_linear",	GL_NEAREST_MIPMAP_LINEAR,	true	},
		{ "linear_mipmap_nearest",	GL_LINEAR_MIPMAP_NEAREST,	true	},
		{ "linear_mipmap_linear",	GL_LINEAR_MIPMAP_LINEAR,	true	}
	};

	tcu::Mat3 minTransform	= tcu::translationMatrix(tcu::Vec2(-0.3f, -0.6f)) * tcu::Mat3(tcu::Vec3(1.7f, 2.3f, 1.0f));
	tcu::Mat3 magTransform	= tcu::translationMatrix(tcu::Vec2( 0.3f,  0.4f)) * tcu::Mat3(tcu::Vec3(0.3f, 0.2f, 1.0f));

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
	{
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
		{
			deUint32	format		= texFormats[formatNdx].internalFormat;
			deUint32	minFilter	= cases[caseNdx].filter;
			deUint32	magFilter	= (minFilter == GL_NEAREST || minFilter == GL_LINEAR) ? minFilter : GL_LINEAR;
			deUint32	wrapS		= GL_REPEAT;
			deUint32	wrapT		= GL_REPEAT;
			int			numTextures	= 1;
			bool		minify		= cases[caseNdx].minify;
			string		name		= string(cases[caseNdx].name) + (minify ? "_minify_" : "_magnify_") + texFormats[formatNdx].name;

			addChild(new Texture2DRenderCase(m_context, name.c_str(), "", format, wrapS, wrapT, minFilter, magFilter, minify ? minTransform : magTransform, numTextures, true /* pot */));
		}
	}
}